

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfSampleCountChannel.cpp
# Opt level: O2

void __thiscall
Imf_2_5::SampleCountChannel::set(SampleCountChannel *this,int x,int y,uint newNumSamples)

{
  uint *oldNumSamples;
  ulong uVar1;
  size_t *psVar2;
  uint *puVar3;
  size_t sVar4;
  uint uVar5;
  uint uVar6;
  uint *puVar7;
  size_t *newSampleListPositions;
  uint uVar8;
  size_t i;
  ulong uVar9;
  long lVar10;
  size_t j;
  ulong uVar11;
  
  oldNumSamples = this->_numSamples;
  uVar8 = this->_base[(long)y * (long)(this->super_ImageChannel)._pixelsPerRow + (long)x];
  lVar10 = (long)(this->_base + (long)y * (long)(this->super_ImageChannel)._pixelsPerRow + (long)x)
           - (long)oldNumSamples;
  if (uVar8 < newNumSamples) {
    i = lVar10 >> 2;
    if (*(uint *)((long)this->_sampleListSizes + lVar10) < newNumSamples) {
      uVar5 = anon_unknown_6::roundListSizeUp(newNumSamples);
      if (this->_sampleBufferSize < this->_totalSamplesOccupied + (long)(int)uVar5) {
        this->_totalNumSamples = this->_totalNumSamples + (ulong)(newNumSamples - uVar8);
        uVar1 = (this->super_ImageChannel)._numPixels;
        puVar7 = (uint *)operator_new__(-(ulong)(uVar1 >> 0x3e != 0) | uVar1 << 2);
        this->_numSamples = puVar7;
        resetBasePointer(this);
        uVar1 = (this->super_ImageChannel)._numPixels;
        psVar2 = this->_sampleListPositions;
        newSampleListPositions = (size_t *)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
        this->_sampleListPositions = newSampleListPositions;
        this->_totalSamplesOccupied = 0;
        puVar7 = this->_numSamples;
        puVar3 = this->_sampleListSizes;
        uVar9 = 0;
        for (uVar11 = 0; uVar1 != uVar11; uVar11 = uVar11 + 1) {
          uVar8 = newNumSamples;
          uVar6 = uVar5;
          if (i != uVar11) {
            uVar8 = oldNumSamples[uVar11];
            uVar6 = anon_unknown_6::roundListSizeUp(uVar8);
          }
          puVar7[uVar11] = uVar8;
          newSampleListPositions[uVar11] = uVar9;
          puVar3[uVar11] = uVar6;
          uVar9 = uVar9 + uVar6;
          this->_totalSamplesOccupied = uVar9;
        }
        this->_sampleBufferSize = (uVar9 >> 1) + uVar9;
        DeepImageLevel::moveSamplesToNewBuffer
                  ((DeepImageLevel *)(this->super_ImageChannel)._level,oldNumSamples,
                   this->_numSamples,newSampleListPositions);
        if (oldNumSamples != (uint *)0x0) {
          operator_delete__(oldNumSamples);
        }
        if (psVar2 == (size_t *)0x0) {
          return;
        }
        operator_delete__(psVar2);
        return;
      }
      DeepImageLevel::moveSampleList
                ((DeepImageLevel *)(this->super_ImageChannel)._level,i,uVar8,newNumSamples,
                 this->_totalSamplesOccupied);
      sVar4 = this->_totalSamplesOccupied;
      this->_sampleListPositions[i] = sVar4;
      this->_totalSamplesOccupied = (long)(int)uVar5 + sVar4;
    }
    else {
      DeepImageLevel::setSamplesToZero
                ((DeepImageLevel *)(this->super_ImageChannel)._level,i,uVar8,newNumSamples);
    }
    this->_totalNumSamples =
         this->_totalNumSamples +
         (ulong)(newNumSamples - *(int *)((long)this->_numSamples + lVar10));
    *(uint *)((long)this->_numSamples + lVar10) = newNumSamples;
  }
  else {
    this->_totalNumSamples = this->_totalNumSamples - (ulong)(uVar8 - newNumSamples);
    *(uint *)((long)oldNumSamples + lVar10) = newNumSamples;
  }
  return;
}

Assistant:

void
SampleCountChannel::set (int x, int y, unsigned int newNumSamples)
{
    //
    // Set the number of samples for pixel (x,y) to newNumSamples.
    // Compute the position of the pixel in the the various
    // arrays that describe it.
    //

    size_t i = (_base + y * pixelsPerRow() + x) - _numSamples;

    if (newNumSamples <= _numSamples[i])
    {
        //
        // The number of samples for the pixel becomes smaller.
        // Save the new number of samples.
        //

        _totalNumSamples -= _numSamples[i] - newNumSamples;
        _numSamples[i] = newNumSamples;
        return;
    }

    if (newNumSamples <= _sampleListSizes[i])
    {
        //
        // The number of samples for the pixel becomes larger, but the new
        // number of samples still fits into the space that has been allocated
        // for the sample list.  Set the new samples at the end of the list to
        // zero.
        //

        deepLevel().setSamplesToZero (i,
                                      _numSamples[i],
                                      newNumSamples);

        _totalNumSamples += newNumSamples - _numSamples[i];
        _numSamples[i] = newNumSamples;
        return;
    }

    int newSampleListSize = roundListSizeUp (newNumSamples);

    if (_totalSamplesOccupied + newSampleListSize <= _sampleBufferSize)
    {
        //
        // The number of samples in the pixel no longer fits into the
        // space that has been allocated for the sample list, but there
        // is space available at the end of the sample buffer.  Allocate
        // space for a new list at the end of the sample buffer, and move
        // the sample list from its old location to its new, larger place.
        //

        deepLevel().moveSampleList
            (i, _numSamples[i], newNumSamples, _totalSamplesOccupied);

        _sampleListPositions[i] = _totalSamplesOccupied;
        _totalSamplesOccupied += newSampleListSize;
        _totalNumSamples += newNumSamples - _numSamples[i];
        _numSamples[i] = newNumSamples;
        return;
    }

    //
    // The new number of samples no longer fits into the space that has
    // been allocated for the sample list, and there is not enough room
    // at the end of the sample buffer for a new, larger sample list.
    // Allocate an entirely new sample buffer, and move all existing
    // sample lists into it.
    //

    unsigned int * oldNumSamples = 0;
    size_t * oldSampleListPositions = 0;

    try
    {
        _totalNumSamples += newNumSamples - _numSamples[i];

        oldNumSamples = _numSamples;
        _numSamples = new unsigned int [numPixels()];

        resetBasePointer();

        oldSampleListPositions = _sampleListPositions;
        _sampleListPositions = new size_t [numPixels()];

        _totalSamplesOccupied = 0;

        for (size_t j = 0; j < numPixels(); ++j)
        {
            if (j == i)
                _numSamples[j] = newNumSamples;
            else
                _numSamples[j] = oldNumSamples[j];

            _sampleListPositions[j] = _totalSamplesOccupied;
            _sampleListSizes[j] = roundListSizeUp (_numSamples[j]);
            _totalSamplesOccupied += _sampleListSizes[j];
        }

        _sampleBufferSize = roundBufferSizeUp (_totalSamplesOccupied);

        deepLevel().moveSamplesToNewBuffer (oldNumSamples,
                                            _numSamples,
                                            _sampleListPositions);

        delete [] oldNumSamples;
        delete [] oldSampleListPositions;
    }
    catch (...)
    {
        delete [] oldNumSamples;
        delete [] oldSampleListPositions;

        level().image().resize (Box2i (V2i (0, 0), V2i (-1, -1)));
        throw;
    }
}